

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall Hospital::validate_String_Must_Be_character(Hospital *this,string *name)

{
  byte bVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ((name->_M_string_length != uVar2 &&
       (bVar1 = (name->_M_dataplus)._M_p[uVar2], '@' < (char)bVar1)) &&
      ((byte)(bVar1 + 0x9f) < 0x1a || bVar1 < 0x5b)); uVar2 = uVar2 + 1) {
  }
  return name->_M_string_length <= uVar2;
}

Assistant:

bool Hospital::validate_String_Must_Be_character(string name) {
    int countr = 0;
    for (int i = 0; i <name.length() ; ++i) {
        if((name[i]>=65 && name[i]<=90) || (name[i]>=97 && name[i]<=122) )countr ++;
        else {
            return false;
        }
    }
    if(countr == name.length())return true ;
}